

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O1

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnodeBushingSpherical::~ChLoadXYZROTnodeXYZROTnodeBushingSpherical
          (ChLoadXYZROTnodeXYZROTnodeBushingSpherical *this)

{
  ChLoadCustomMultiple::~ChLoadCustomMultiple((ChLoadCustomMultiple *)this);
  operator_delete(this,0x3c8);
  return;
}

Assistant:

class ChApi ChLoadXYZROTnodeXYZROTnodeBushingSpherical : public ChLoadXYZROTnodeXYZROTnode {
  public:
    ChLoadXYZROTnodeXYZROTnodeBushingSpherical(
        std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A
        std::shared_ptr<ChNodeFEAxyzrot> mnodeB,  ///< node B
        const ChFrame<>&
            abs_application,  ///< create bushing here, in abs. coordinates. Will define loc_application_A and B
        const ChVector<>& mstiffness,  ///< stiffness, along x y z axes of the abs_application
        const ChVector<>& mdamping     ///< damping, along x y z axes of the abs_application
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZROTnodeXYZROTnodeBushingSpherical* Clone() const override {
        return new ChLoadXYZROTnodeXYZROTnodeBushingSpherical(*this);
    }

    /// Set stiffness, along the x y z axes of frame of loc_application_B, es [N/m]
    void SetStiffness(const ChVector<> mstiffness) { stiffness = mstiffness; }
    ChVector<> GetStiffness() const { return stiffness; }

    /// Set damping, along the x y z axes of frame of loc_application_B, es [Ns/m]
    void SetDamping(const ChVector<> mdamping) { damping = mdamping; }
    ChVector<> GetDamping() const { return damping; }

  protected:
    ChVector<> stiffness;
    ChVector<> damping;

    virtual bool IsStiff() override { return true; }

    /// Compute the wrench (force & torque) between the two nodes, expressed in local frame of loc_application_B,
    /// given rel_AB, i.e. the position and speed of loc_application_A respect to loc_application_B, expressed in frame
    /// of loc_application_B. Force is assumed applied to loc_application_B, and its opposite reaction to A.
    virtual void ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                    ChVector<>& loc_force,
                                    ChVector<>& loc_torque) override;
}